

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

void __thiscall capnp::DynamicStruct::Reader::verifySetInUnion(Reader *this,Field field)

{
  ushort uVar1;
  uint uVar2;
  DebugExpression<bool> _kjCondition;
  Fault f;
  Reader local_a8;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  Reader local_50;
  
  if ((0x1f < field.proto._reader.dataSize) && (*(short *)((long)field.proto._reader.data + 2) != 0)
     ) {
    Schema::getProto(&local_a8,(Schema *)this);
    uVar2 = 0;
    if (0x11f < local_a8._reader.dataSize) {
      uVar2 = *(uint *)((long)local_a8._reader.data + 0x20);
    }
    if ((ulong)(this->reader).dataSize < (ulong)(uVar2 + 1) << 4) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)((long)(this->reader).data + (ulong)uVar2 * 2);
    }
    _kjCondition.value = (uVar1 ^ *(ushort *)((long)field.proto._reader.data + 2)) == 0xffff;
    if (!_kjCondition.value) {
      local_a8._reader._32_8_ = field.proto._reader._32_8_;
      local_a8._reader.nestingLimit = field.proto._reader.nestingLimit;
      local_a8._reader._44_4_ = field.proto._reader._44_4_;
      local_a8._reader.data = field.proto._reader.data;
      local_a8._reader.pointers = field.proto._reader.pointers;
      local_a8._reader.segment = field.proto._reader.segment;
      local_a8._reader.capTable = field.proto._reader.capTable;
      local_60 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_a8);
      Schema::getProto(&local_50,(Schema *)this);
      local_70 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_50);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[66],capnp::Text::Reader,capnp::Text::Reader>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x8f,FAILED,"isSetInUnion(field)",
                 "_kjCondition,\"Tried to get() a union member which is not currently initialized.\", field.getProto().getName(), schema.getProto().getDisplayName()"
                 ,&_kjCondition,
                 (char (*) [66])"Tried to get() a union member which is not currently initialized.",
                 (Reader *)&local_60,(Reader *)&local_70);
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  return;
}

Assistant:

DynamicValue::Builder DynamicList::Builder::operator[](uint index) {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return builder.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getStructList(structSizeFromSchema(elementType.getStructElementType()),
                                  nullptr));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getList(elementSizeFor(elementType.whichElementType()), nullptr));
      }
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Builder(schema.getStructElementType(),
                                    builder.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         builder.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       builder.getPointerElement(bounded(index) * ELEMENTS)
                                              .getCapability());
  }

  return nullptr;
}